

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExistingFileNamer.cpp
# Opt level: O2

string * __thiscall
ApprovalTests::ExistingFileNamer::getApprovedFile
          (string *__return_storage_ptr__,ExistingFileNamer *this,string *extensionWithDot)

{
  undefined1 local_48 [48];
  
  Options::getNamer((Options *)local_48);
  ::std::__cxx11::string::string((string *)(local_48 + 0x10),(string *)extensionWithDot);
  (*(code *)(((FileOptions *)local_48._0_8_)->options_->fileOptions_).fileExtensionWithDot_.
            _M_string_length)(__return_storage_ptr__,local_48._0_8_,local_48 + 0x10);
  ::std::__cxx11::string::~string((string *)(local_48 + 0x10));
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_48 + 8));
  return __return_storage_ptr__;
}

Assistant:

std::string ExistingFileNamer::getApprovedFile(std::string extensionWithDot) const
    {
        return options_.getNamer()->getApprovedFile(extensionWithDot);
    }